

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O3

Transaction * __thiscall
duckdb::MetaTransaction::GetTransaction(MetaTransaction *this,AttachedDatabase *db)

{
  pointer *pprVar1;
  iterator __position;
  int iVar2;
  __node_base_ptr p_Var3;
  TransactionManager *pTVar4;
  Transaction *pTVar5;
  __hash_code __code;
  key_type local_38;
  Transaction *local_30;
  undefined4 extraout_var;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 == 0) {
    local_38._M_data = db;
    p_Var3 = ::std::
             _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,_std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->transactions)._M_h,
                        (ulong)db % (this->transactions)._M_h._M_bucket_count,&local_38,
                        (__hash_code)db);
    if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
      pTVar4 = AttachedDatabase::GetTransactionManager(db);
      iVar2 = (*pTVar4->_vptr_TransactionManager[2])(pTVar4,this->context);
      pTVar5 = (Transaction *)CONCAT44(extraout_var,iVar2);
      LOCK();
      (pTVar5->active_query).super___atomic_base<unsigned_long>._M_i =
           (this->active_query).super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
      __position._M_current =
           (this->all_transactions).
           super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->all_transactions).
          super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_38._M_data = db;
        ::std::
        vector<std::reference_wrapper<duckdb::AttachedDatabase>,std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::AttachedDatabase>>
                  ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>>>
                    *)&this->all_transactions,__position,&local_38);
      }
      else {
        (__position._M_current)->_M_data = db;
        pprVar1 = &(this->all_transactions).
                   super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + 1;
      }
      local_38._M_data = db;
      local_30 = pTVar5;
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,std::pair<std::reference_wrapper<duckdb::AttachedDatabase>const,std::reference_wrapper<duckdb::Transaction>>,std::allocator<std::pair<std::reference_wrapper<duckdb::AttachedDatabase>const,std::reference_wrapper<duckdb::Transaction>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::AttachedDatabase>,duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<duckdb::AttachedDatabase&,duckdb::Transaction&>>
                ((_Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,std::pair<std::reference_wrapper<duckdb::AttachedDatabase>const,std::reference_wrapper<duckdb::Transaction>>,std::allocator<std::pair<std::reference_wrapper<duckdb::AttachedDatabase>const,std::reference_wrapper<duckdb::Transaction>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::AttachedDatabase>,duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->transactions);
    }
    else {
      pTVar5 = (Transaction *)p_Var3->_M_nxt[2]._M_nxt;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return pTVar5;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

Transaction &MetaTransaction::GetTransaction(AttachedDatabase &db) {
	lock_guard<mutex> guard(lock);
	auto entry = transactions.find(db);
	if (entry == transactions.end()) {
		auto &new_transaction = db.GetTransactionManager().StartTransaction(context);
		new_transaction.active_query = active_query.load();
#ifdef DEBUG
		VerifyAllTransactionsUnique(db, all_transactions);
#endif
		all_transactions.push_back(db);
		transactions.insert(make_pair(reference<AttachedDatabase>(db), reference<Transaction>(new_transaction)));

		return new_transaction;
	} else {
		D_ASSERT(entry->second.get().active_query == active_query);
		return entry->second;
	}
}